

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

void __thiscall MT32Emu::Synth::playMsgNow(Synth *this,Bit32u msg)

{
  byte part;
  Extensions *pEVar1;
  ulong uVar2;
  
  if (this->opened == true) {
    pEVar1 = this->extensions;
    if (pEVar1->chantable[msg & 0xf][0] < 9) {
      uVar2 = (ulong)pEVar1->abortingPartIx;
      while( true ) {
        if (8 < uVar2) {
          return;
        }
        part = pEVar1->chantable[msg & 0xf][uVar2];
        if (8 < part) {
          return;
        }
        playMsgOnPart(this,part,(byte)msg >> 4,(byte)(msg >> 8) & 0x7f,(byte)(msg >> 0x10) & 0x7f);
        if (this->abortingPoly != (Poly *)0x0) break;
        if (this->extensions->abortingPartIx != 0) {
          this->extensions->abortingPartIx = 0;
        }
        uVar2 = uVar2 + 1;
      }
      this->extensions->abortingPartIx = (Bit32u)uVar2;
    }
  }
  return;
}

Assistant:

void Synth::playMsgNow(Bit32u msg) {
	if (!opened) return;

	// NOTE: Active sense IS implemented in real hardware. However, realtime processing is clearly out of the library scope.
	//       It is assumed that realtime consumers of the library respond to these MIDI events as appropriate.

	Bit8u code = Bit8u((msg & 0x0000F0) >> 4);
	Bit8u chan = Bit8u(msg & 0x00000F);
	Bit8u note = Bit8u((msg & 0x007F00) >> 8);
	Bit8u velocity = Bit8u((msg & 0x7F0000) >> 16);

	//printDebug("Playing chan %d, code 0x%01x note: 0x%02x", chan, code, note);

	Bit8u *chanParts = extensions.chantable[chan];
	if (*chanParts > 8) {
#if MT32EMU_MONITOR_MIDI > 0
		printDebug("Play msg on unreg chan %d (%d): code=0x%01x, vel=%d", chan, *chanParts, code, velocity);
#endif
		return;
	}
	for (Bit32u i = extensions.abortingPartIx; i <= 8; i++) {
		const Bit32u partNum = chanParts[i];
		if (partNum > 8) break;
		playMsgOnPart(partNum, code, note, velocity);
		if (isAbortingPoly()) {
			extensions.abortingPartIx = i;
			break;
		} else if (extensions.abortingPartIx) {
			extensions.abortingPartIx = 0;
		}
	}
}